

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_prepare.cpp
# Opt level: O2

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,PrepareStatement *stmt)

{
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var1;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var2;
  Binder *pBVar3;
  StatementProperties *pSVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator local_1c2;
  allocator_type local_1c1;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
  local_1c0;
  SQLStatement *local_1b8;
  LogicalType local_1b0;
  shared_ptr<duckdb::PreparedStatementData,_true> prepared_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  Planner prepared_planner;
  
  Planner::Planner(&prepared_planner,this->context);
  local_1b8 = (stmt->statement).
              super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
              _M_t.
              super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
              .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (stmt->statement).
  super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
  Planner::PrepareSQLStatement
            ((Planner *)&prepared_data,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             &prepared_planner);
  if (local_1b8 != (SQLStatement *)0x0) {
    (*local_1b8->_vptr_SQLStatement[1])();
  }
  local_1b8 = (SQLStatement *)0x0;
  pBVar3 = shared_ptr<duckdb::Binder,_true>::operator->(&prepared_planner.binder);
  this->bound_tables = pBVar3->bound_tables;
  make_uniq<duckdb::LogicalPrepare,std::__cxx11::string&,duckdb::shared_ptr<duckdb::PreparedStatementData,true>,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
            ((duckdb *)&local_1c0,&stmt->name,&prepared_data,&prepared_planner.plan);
  pSVar4 = GetStatementProperties(this);
  pSVar4->requires_valid_transaction = false;
  pSVar4->allow_stream_result = false;
  pSVar4->bound_all_parameters = true;
  pSVar4->return_type = NOTHING;
  pSVar4->parameter_count = 0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::__cxx11::string::string((string *)&local_188,"Success",&local_1c2);
  __l._M_len = 1;
  __l._M_array = &local_188;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_1b0,__l,&local_1c1);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__return_storage_ptr__->names,&local_1b0);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1b0);
  ::std::__cxx11::string::~string((string *)&local_188);
  LogicalType::LogicalType(&local_1b0,BOOLEAN);
  __l_00._M_len = 1;
  __l_00._M_array = &local_1b0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_188,__l_00,
             (allocator_type *)&local_1c2);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&(__return_storage_ptr__->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&local_188);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_188);
  LogicalType::~LogicalType(&local_1b0);
  _Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       local_1c0.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  local_1c0.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)(LogicalOperator *)0x0;
  _Var1.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (__return_storage_ptr__->plan).
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       _Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  if (_Var1.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (LogicalOperator *)0x0) {
    (**(code **)(*(long *)_Var1.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                + 8))();
    if (local_1c0.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
        (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_1c0.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                            _M_head_impl + 8))();
    }
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&prepared_data.internal.
              super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Planner::~Planner(&prepared_planner);
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Binder::Bind(PrepareStatement &stmt) {
	Planner prepared_planner(context);
	auto prepared_data = prepared_planner.PrepareSQLStatement(std::move(stmt.statement));
	this->bound_tables = prepared_planner.binder->bound_tables;

	auto prepare = make_uniq<LogicalPrepare>(stmt.name, std::move(prepared_data), std::move(prepared_planner.plan));
	// we can always prepare, even if the transaction has been invalidated
	// this is required because most clients ALWAYS invoke prepared statements
	auto &properties = GetStatementProperties();
	properties.requires_valid_transaction = false;
	properties.allow_stream_result = false;
	properties.bound_all_parameters = true;
	properties.parameter_count = 0;
	properties.return_type = StatementReturnType::NOTHING;

	BoundStatement result;
	result.names = {"Success"};
	result.types = {LogicalType::BOOLEAN};
	result.plan = std::move(prepare);
	return result;
}